

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_fs_open(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  undefined8 uVar5;
  uv_process_t *tcp;
  uv_buf_t *buf;
  ulong unaff_RBX;
  undefined1 *puVar6;
  anon_union_8_2_26168aa3_for_data aVar7;
  uv_process_t *puVar8;
  code *nread;
  uv_timer_t *puVar9;
  undefined1 auVar10 [16];
  uv_os_fd_t dup_fd;
  uv_os_fd_t fd;
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_pipe_t in;
  uv_fs_t fs_req;
  uv_write_t write_req2;
  uv_write_t write_req;
  undefined1 auStack_7c0 [24];
  uv_stdio_container_t uStack_7a8;
  undefined4 uStack_798;
  undefined4 uStack_788;
  uv_stream_t uStack_778;
  uv_stream_t uStack_670;
  code *pcStack_4b8;
  code *pcStack_4b0;
  int local_4a0;
  int local_49c;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined2 local_480;
  uv_stdio_container_t local_478;
  undefined1 local_460 [264];
  undefined1 local_358 [88];
  undefined4 local_300;
  undefined1 local_1a0 [192];
  undefined1 local_e0 [192];
  
  local_488 = 0x6c756e2f7665642f;
  local_480 = 0x6c;
  puVar6 = local_358;
  pcStack_4b0 = (code *)0x17b77b;
  uVar1 = uv_fs_open(0,puVar6,&local_488,2,0,0);
  iVar4 = (int)puVar6;
  if (uVar1 == 0xffffffff) {
    pcStack_4b0 = (code *)0x17b93e;
    run_test_spawn_fs_open_cold_10();
LAB_0017b93e:
    pcStack_4b0 = (code *)0x17b943;
    run_test_spawn_fs_open_cold_1();
LAB_0017b943:
    pcStack_4b0 = (code *)0x17b948;
    run_test_spawn_fs_open_cold_2();
LAB_0017b948:
    pcStack_4b0 = (code *)0x17b94d;
    run_test_spawn_fs_open_cold_3();
LAB_0017b94d:
    pcStack_4b0 = (code *)0x17b952;
    run_test_spawn_fs_open_cold_4();
LAB_0017b952:
    pcStack_4b0 = (code *)0x17b957;
    run_test_spawn_fs_open_cold_5();
LAB_0017b957:
    pcStack_4b0 = (code *)0x17b95c;
    run_test_spawn_fs_open_cold_6();
LAB_0017b95c:
    pcStack_4b0 = (code *)0x17b961;
    run_test_spawn_fs_open_cold_7();
LAB_0017b961:
    pcStack_4b0 = (code *)0x17b966;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    unaff_RBX = (ulong)uVar1;
    pcStack_4b0 = (code *)0x17b797;
    iVar2 = uv_get_osfhandle(local_300);
    pcStack_4b0 = (code *)0x17b7a5;
    local_49c = iVar2;
    uv_fs_req_cleanup(local_358);
    pcStack_4b0 = (code *)0x17b7b8;
    init_process_options("spawn_helper8",exit_cb);
    pcStack_4b0 = (code *)0x17b7bd;
    uVar5 = uv_default_loop();
    pcStack_4b0 = (code *)0x17b7cf;
    aVar7.stream = (uv_stream_t *)local_460;
    iVar3 = uv_pipe_init(uVar5,(uv_stream_t *)local_460,0);
    iVar4 = aVar7.fd;
    if (iVar3 != 0) goto LAB_0017b93e;
    options.stdio = &local_478;
    local_478.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    pcStack_4b0 = (code *)0x17b805;
    local_478.data.stream = (uv_stream_t *)local_460;
    local_4a0 = dup(iVar2);
    pcStack_4b0 = (code *)0x17b80e;
    uVar5 = uv_default_loop();
    iVar4 = 0x331810;
    pcStack_4b0 = (code *)0x17b820;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0017b943;
    pcStack_4b0 = (code *)0x17b837;
    local_498 = uv_buf_init(&local_49c,4);
    puVar6 = local_460;
    pcStack_4b0 = (code *)0x17b864;
    iVar2 = uv_write(local_e0,puVar6,local_498,1,write_null_cb);
    iVar4 = (int)puVar6;
    if (iVar2 != 0) goto LAB_0017b948;
    pcStack_4b0 = (code *)0x17b87b;
    auVar10 = uv_buf_init(&local_4a0,4);
    puVar6 = local_460;
    pcStack_4b0 = (code *)0x17b8a8;
    local_498 = auVar10;
    iVar2 = uv_write(local_1a0,puVar6,local_498,1,write_cb);
    iVar4 = (int)puVar6;
    if (iVar2 != 0) goto LAB_0017b94d;
    pcStack_4b0 = (code *)0x17b8b5;
    uVar5 = uv_default_loop();
    iVar4 = 0;
    pcStack_4b0 = (code *)0x17b8bf;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0017b952;
    puVar6 = local_358;
    pcStack_4b0 = (code *)0x17b8da;
    iVar2 = uv_fs_close(0,puVar6,unaff_RBX,0);
    iVar4 = (int)puVar6;
    if (iVar2 != 0) goto LAB_0017b957;
    if (exit_cb_called != 1) goto LAB_0017b95c;
    if (close_cb_called != 2) goto LAB_0017b961;
    pcStack_4b0 = (code *)0x17b8f5;
    unaff_RBX = uv_default_loop();
    pcStack_4b0 = (code *)0x17b909;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar4 = 0;
    pcStack_4b0 = (code *)0x17b913;
    uv_run(unaff_RBX);
    pcStack_4b0 = (code *)0x17b918;
    uVar5 = uv_default_loop();
    pcStack_4b0 = (code *)0x17b920;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      pcStack_4b0 = (code *)0x17b929;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_4b0 = write_null_cb;
  run_test_spawn_fs_open_cold_9();
  if (iVar4 == 0) {
    return extraout_EAX;
  }
  pcStack_4b8 = run_test_closed_fd_events;
  write_null_cb_cold_1();
  pcStack_4b8 = (code *)unaff_RBX;
  auStack_7c0._8_16_ = uv_buf_init("");
  tcp = (uv_process_t *)auStack_7c0;
  nread = (code *)0x0;
  iVar4 = uv_pipe(tcp,0,0);
  if (iVar4 == 0) {
    if ((int)auStack_7c0._0_4_ < 3) goto LAB_0017bc5a;
    if ((int)auStack_7c0._4_4_ < 3) goto LAB_0017bc5f;
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_7a8;
    uStack_7a8.flags = UV_INHERIT_FD;
    uStack_7a8.data.fd = auStack_7c0._0_4_;
    uStack_798 = 0;
    uStack_788 = 0;
    tcp = (uv_process_t *)uv_default_loop();
    puVar8 = &process;
    iVar4 = uv_spawn(tcp,&process,&options);
    nread = (code *)puVar8;
    if (iVar4 != 0) goto LAB_0017bc64;
    uv_unref(&process);
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_778;
    iVar4 = uv_pipe_init(tcp,nread,0);
    if (iVar4 != 0) goto LAB_0017bc69;
    nread = (code *)(ulong)(uint)auStack_7c0._0_4_;
    tcp = (uv_process_t *)&uStack_778;
    iVar4 = uv_pipe_open();
    if (iVar4 != 0) goto LAB_0017bc6e;
    auStack_7c0._0_4_ = 0xffffffff;
    nread = on_alloc;
    tcp = (uv_process_t *)&uStack_778;
    iVar4 = uv_read_start(tcp,on_alloc,on_read_once);
    if (iVar4 != 0) goto LAB_0017bc73;
    nread = (code *)&uStack_670;
    tcp = (uv_process_t *)0x0;
    iVar4 = uv_fs_write(0,nread,auStack_7c0._4_4_,auStack_7c0 + 8,1,0xffffffffffffffff,0);
    if (iVar4 != 1) goto LAB_0017bc78;
    if (uStack_670._88_8_ != 1) goto LAB_0017bc7d;
    uv_fs_req_cleanup(&uStack_670);
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_0017bc82;
    if (output_used != 1) goto LAB_0017bc87;
    uv_close(&uStack_778,close_cb);
    nread = (code *)&uStack_670;
    tcp = (uv_process_t *)0x0;
    iVar4 = uv_fs_write(0,nread,auStack_7c0._4_4_,auStack_7c0 + 8,1,0xffffffffffffffff,0);
    if (iVar4 != 1) goto LAB_0017bc8c;
    if (uStack_670._88_8_ != 1) goto LAB_0017bc91;
    uv_fs_req_cleanup(&uStack_670);
    tcp = (uv_process_t *)uv_default_loop();
    puVar9 = &timer;
    iVar4 = uv_timer_init();
    nread = (code *)puVar9;
    if (iVar4 != 0) goto LAB_0017bc96;
    puVar9 = &timer;
    nread = timer_counter_cb;
    iVar4 = uv_timer_start(&timer,timer_counter_cb,10,0);
    tcp = (uv_process_t *)puVar9;
    if (iVar4 != 0) goto LAB_0017bc9b;
    tcp = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar4 = uv_run();
    if (iVar4 == 1) {
      tcp = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar4 = uv_run();
      if (iVar4 != 0) goto LAB_0017bcb4;
    }
    if (timer_counter != 1) goto LAB_0017bca0;
    tcp = &process;
    nread = (code *)0xf;
    iVar4 = uv_process_kill();
    if (iVar4 != 0) goto LAB_0017bca5;
    tcp = (uv_process_t *)(ulong)(uint)auStack_7c0._4_4_;
    iVar4 = close(auStack_7c0._4_4_);
    if (iVar4 != 0) goto LAB_0017bcaa;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar5);
    tcp = (uv_process_t *)uv_default_loop();
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0017bc5a:
    run_test_closed_fd_events_cold_2();
LAB_0017bc5f:
    run_test_closed_fd_events_cold_3();
LAB_0017bc64:
    run_test_closed_fd_events_cold_4();
LAB_0017bc69:
    run_test_closed_fd_events_cold_5();
LAB_0017bc6e:
    run_test_closed_fd_events_cold_6();
LAB_0017bc73:
    run_test_closed_fd_events_cold_7();
LAB_0017bc78:
    run_test_closed_fd_events_cold_8();
LAB_0017bc7d:
    run_test_closed_fd_events_cold_9();
LAB_0017bc82:
    run_test_closed_fd_events_cold_10();
LAB_0017bc87:
    run_test_closed_fd_events_cold_11();
LAB_0017bc8c:
    run_test_closed_fd_events_cold_12();
LAB_0017bc91:
    run_test_closed_fd_events_cold_13();
LAB_0017bc96:
    run_test_closed_fd_events_cold_14();
LAB_0017bc9b:
    run_test_closed_fd_events_cold_15();
LAB_0017bca0:
    run_test_closed_fd_events_cold_17();
LAB_0017bca5:
    run_test_closed_fd_events_cold_18();
LAB_0017bcaa:
    run_test_closed_fd_events_cold_19();
  }
  run_test_closed_fd_events_cold_20();
LAB_0017bcb4:
  run_test_closed_fd_events_cold_16();
  uv_read_stop();
  on_read((uv_stream_t *)tcp,(ssize_t)nread,buf);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, O_RDWR, 0, NULL);
  ASSERT(r != -1);
  fd = uv_get_osfhandle((uv_file) fs_req.result);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT(0 != DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                              0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT(pCompareObjectHandles == NULL || pCompareObjectHandles(fd, dup_fd));
#else
  dup_fd = dup(fd);
#endif

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, r, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}